

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void exprCodeBetween(Parse *pParse,Expr *pExpr,int dest,_func_void_Parse_ptr_Expr_ptr_int_int *xJump
                    ,int jumpIfNull)

{
  byte bVar1;
  uint uVar2;
  int iReg;
  size_t __n;
  size_t sVar3;
  int regFree1;
  Expr exprAnd;
  Expr exprX;
  Expr compRight;
  Expr compLeft;
  int local_170;
  int local_16c;
  Expr local_168;
  Expr local_118;
  Expr local_c8;
  Expr local_78;
  
  local_170 = 0;
  local_78.op = '\0';
  local_78.affinity = '\0';
  local_78._2_2_ = 0;
  local_78.flags = 0;
  local_78.u.zToken = (char *)0x0;
  local_78.pLeft = (Expr *)0x0;
  local_78.pRight = (Expr *)0x0;
  local_78.x.pList = (ExprList *)0x0;
  local_78.nHeight = 0;
  local_78.iTable = 0;
  local_78.iColumn = 0;
  local_78.iAgg = 0;
  local_78.iRightJoinTable = 0;
  local_78.op2 = '\0';
  local_78._55_1_ = 0;
  local_78.pAggInfo = (AggInfo *)0x0;
  local_78.y.pTab = (Table *)0x0;
  local_c8.op = '\0';
  local_c8.affinity = '\0';
  local_c8._2_2_ = 0;
  local_c8.flags = 0;
  local_c8.u.zToken = (char *)0x0;
  local_c8.pLeft = (Expr *)0x0;
  local_c8.pRight = (Expr *)0x0;
  local_c8.x.pList = (ExprList *)0x0;
  local_c8.nHeight = 0;
  local_c8.iTable = 0;
  local_c8.iColumn = 0;
  local_c8.iAgg = 0;
  local_c8.iRightJoinTable = 0;
  local_c8.op2 = '\0';
  local_c8._55_1_ = 0;
  local_c8.pAggInfo = (AggInfo *)0x0;
  local_c8.y.pTab = (Table *)0x0;
  local_168.op = '\0';
  local_168.affinity = '\0';
  local_168._2_2_ = 0;
  local_168.flags = 0;
  local_168.u.zToken = (char *)0x0;
  local_168.pLeft = (Expr *)0x0;
  local_168.pRight = (Expr *)0x0;
  local_168.x.pList = (ExprList *)0x0;
  local_168.nHeight = 0;
  local_168.iTable = 0;
  local_168.iColumn = 0;
  local_168.iAgg = 0;
  local_168.iRightJoinTable = 0;
  local_168.op2 = '\0';
  local_168._55_1_ = 0;
  local_168.pAggInfo = (AggInfo *)0x0;
  local_168.y.pTab = (Table *)0x0;
  local_118.y.pTab = (Table *)0x0;
  local_118.iColumn = 0;
  local_118.iAgg = 0;
  local_118.iRightJoinTable = 0;
  local_118.op2 = '\0';
  local_118._55_1_ = 0;
  local_118.pAggInfo = (AggInfo *)0x0;
  local_118.x.pList = (ExprList *)0x0;
  local_118.nHeight = 0;
  local_118.iTable = 0;
  local_118.pLeft = (Expr *)0x0;
  local_118.pRight = (Expr *)0x0;
  local_118.op = '\0';
  local_118.affinity = '\0';
  local_118._2_2_ = 0;
  local_118.flags = 0;
  local_118.u.zToken = (char *)0x0;
  uVar2 = pExpr->pLeft->flags;
  sVar3 = 0x2c;
  if ((uVar2 >> 0xd & 1) == 0) {
    sVar3 = 0x48;
  }
  __n = 0x10;
  if ((uVar2 >> 0xe & 1) == 0) {
    __n = sVar3;
  }
  local_16c = jumpIfNull;
  memcpy(&local_118,pExpr->pLeft,__n);
  local_168.op = ',';
  local_78.op = '9';
  local_78.pRight = *(Expr **)&((pExpr->x).pSelect)->op;
  local_c8.op = '7';
  local_c8.pRight = (Expr *)((pExpr->x).pSelect)->pSrc;
  local_168.pLeft = &local_78;
  local_168.pRight = &local_c8;
  local_c8.pLeft = &local_118;
  local_78.pLeft = &local_118;
  iReg = exprCodeVector(pParse,&local_118,&local_170);
  exprToRegister(&local_118,iReg);
  if (xJump == (_func_void_Parse_ptr_Expr_ptr_int_int *)0x0) {
    local_118._0_8_ = local_118._0_8_ | 0x100000000;
    sqlite3ExprCodeTarget(pParse,&local_168,dest);
  }
  else {
    (*xJump)(pParse,&local_168,dest,local_16c);
  }
  if (local_170 != 0) {
    bVar1 = pParse->nTempReg;
    if ((ulong)bVar1 < 8) {
      pParse->nTempReg = bVar1 + 1;
      pParse->aTempReg[bVar1] = local_170;
    }
  }
  return;
}

Assistant:

static void exprCodeBetween(
  Parse *pParse,    /* Parsing and code generating context */
  Expr *pExpr,      /* The BETWEEN expression */
  int dest,         /* Jump destination or storage location */
  void (*xJump)(Parse*,Expr*,int,int), /* Action to take */
  int jumpIfNull    /* Take the jump if the BETWEEN is NULL */
){
 Expr exprAnd;     /* The AND operator in  x>=y AND x<=z  */
  Expr compLeft;    /* The  x>=y  term */
  Expr compRight;   /* The  x<=z  term */
  Expr exprX;       /* The  x  subexpression */
  int regFree1 = 0; /* Temporary use register */

  memset(&compLeft, 0, sizeof(Expr));
  memset(&compRight, 0, sizeof(Expr));
  memset(&exprAnd, 0, sizeof(Expr));

  assert( !ExprHasProperty(pExpr, EP_xIsSelect) );
  exprNodeCopy(&exprX, pExpr->pLeft);
  exprAnd.op = TK_AND;
  exprAnd.pLeft = &compLeft;
  exprAnd.pRight = &compRight;
  compLeft.op = TK_GE;
  compLeft.pLeft = &exprX;
  compLeft.pRight = pExpr->x.pList->a[0].pExpr;
  compRight.op = TK_LE;
  compRight.pLeft = &exprX;
  compRight.pRight = pExpr->x.pList->a[1].pExpr;
  exprToRegister(&exprX, exprCodeVector(pParse, &exprX, &regFree1));
  if( xJump ){
    xJump(pParse, &exprAnd, dest, jumpIfNull);
  }else{
    /* Mark the expression is being from the ON or USING clause of a join
    ** so that the sqlite3ExprCodeTarget() routine will not attempt to move
    ** it into the Parse.pConstExpr list.  We should use a new bit for this,
    ** for clarity, but we are out of bits in the Expr.flags field so we
    ** have to reuse the EP_FromJoin bit.  Bummer. */
    exprX.flags |= EP_FromJoin;
    sqlite3ExprCodeTarget(pParse, &exprAnd, dest);
  }
  sqlite3ReleaseTempReg(pParse, regFree1);

  /* Ensure adequate test coverage */
  testcase( xJump==sqlite3ExprIfTrue  && jumpIfNull==0 && regFree1==0 );
  testcase( xJump==sqlite3ExprIfTrue  && jumpIfNull==0 && regFree1!=0 );
  testcase( xJump==sqlite3ExprIfTrue  && jumpIfNull!=0 && regFree1==0 );
  testcase( xJump==sqlite3ExprIfTrue  && jumpIfNull!=0 && regFree1!=0 );
  testcase( xJump==sqlite3ExprIfFalse && jumpIfNull==0 && regFree1==0 );
  testcase( xJump==sqlite3ExprIfFalse && jumpIfNull==0 && regFree1!=0 );
  testcase( xJump==sqlite3ExprIfFalse && jumpIfNull!=0 && regFree1==0 );
  testcase( xJump==sqlite3ExprIfFalse && jumpIfNull!=0 && regFree1!=0 );
  testcase( xJump==0 );
}